

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

string __thiscall
mjs::anon_unknown_63::array_join(anon_unknown_63 *this,object_ptr *o,wstring_view *sep)

{
  gc_heap *h_00;
  uint32_t uVar1;
  value_type vVar2;
  object *poVar3;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined1 auVar4 [16];
  wstring_view wVar5;
  string sVar6;
  wstring_view local_130;
  string local_120;
  wstring_view local_110;
  wstring local_100;
  undefined1 local_e0 [16];
  value local_d0;
  value *local_a8;
  value *oi;
  wstring local_98 [4];
  uint32_t i;
  wstring s;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_68;
  value local_58;
  uint32_t local_2c;
  gc_heap *pgStack_28;
  uint32_t l;
  gc_heap *h;
  wstring_view *sep_local;
  object_ptr *o_local;
  
  h = (gc_heap *)sep;
  sep_local = (wstring_view *)o;
  o_local = (object_ptr *)this;
  pgStack_28 = gc_heap_ptr_untyped::heap(&o->super_gc_heap_ptr_untyped);
  poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)sep_local);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_68,L"length");
  (**poVar3->_vptr_object)(&local_58,poVar3,&local_68);
  uVar1 = to_uint32(&local_58);
  value::~value(&local_58);
  local_2c = uVar1;
  std::__cxx11::wstring::wstring(local_98);
  for (oi._4_4_ = 0; h_00 = pgStack_28, oi._4_4_ < local_2c; oi._4_4_ = oi._4_4_ + 1) {
    if (oi._4_4_ != 0) {
      std::__cxx11::wstring::operator+=
                (local_98,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)h);
    }
    poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)sep_local);
    index_string_abi_cxx11_(&local_100,(mjs *)(ulong)oi._4_4_,index);
    auVar4 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_100);
    local_e0 = auVar4;
    (**poVar3->_vptr_object)(&local_d0,poVar3,local_e0);
    std::__cxx11::wstring::~wstring((wstring *)&local_100);
    local_a8 = &local_d0;
    vVar2 = value::type(local_a8);
    if (vVar2 != undefined) {
      vVar2 = value::type(local_a8);
      if (vVar2 != null) {
        to_string((mjs *)&local_120,pgStack_28,local_a8);
        wVar5 = string::view(&local_120);
        local_110 = wVar5;
        std::__cxx11::wstring::operator+=(local_98,&local_110);
        string::~string(&local_120);
      }
    }
    value::~value(&local_d0);
  }
  local_130 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_98);
  string::string((string *)this,h_00,&local_130);
  std::__cxx11::wstring::~wstring(local_98);
  sVar6.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar6.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar6.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string array_join(const object_ptr& o, const std::wstring_view& sep) {
    auto& h = o.heap();
    const uint32_t l = to_uint32(o->get(L"length"));
    std::wstring s;
    for (uint32_t i = 0; i < l; ++i) {
        if (i) s += sep;
        const auto& oi = o->get(index_string(i));
        if (oi.type() != value_type::undefined && oi.type() != value_type::null) {
            s += to_string(h, oi).view();
        }
    }
    return string{h, s};
}